

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

avector<AffineSpace3ff> * __thiscall
embree::XMLLoader::loadQuaternionArray(XMLLoader *this,Ref<embree::XML> *xml)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  bool bVar4;
  size_t sVar5;
  unsigned_long *puVar6;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar7;
  runtime_error *this_00;
  long *in_RDX;
  avector<AffineSpace3ff> *in_RDI;
  Ref<embree::XML> child;
  size_t i;
  avector<AffineSpace3ff> *spaceArray;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> v;
  Ref<embree::XML> *in_stack_00000288;
  XMLLoader *in_stack_00000290;
  size_t i_6;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items;
  size_t i_2;
  size_t i_1;
  size_t new_size_alloced;
  char *in_stack_fffffffffffffaf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  size_t in_stack_fffffffffffffb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ParseLocation *in_stack_fffffffffffffba8;
  string local_438 [24];
  size_t in_stack_fffffffffffffbe0;
  XML *in_stack_fffffffffffffbe8;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  long *local_3d0 [3];
  ulong local_3b8;
  undefined1 local_3a9;
  long *local_3a8;
  long *local_390;
  long *local_388;
  long *local_380;
  XML *local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 *local_310;
  long **local_300;
  XML **local_2e0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_2d8;
  undefined8 *local_2d0;
  Vector *local_2c8;
  undefined1 *local_2c0;
  XML **local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  XML **local_2a0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_298;
  Vector *local_290;
  Vector *local_288;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  XML **local_268;
  undefined8 *local_260;
  Vector *local_258;
  undefined1 *local_250;
  XML **local_248;
  undefined8 *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined1 *local_220;
  XML **local_218;
  XML **local_210;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_208;
  undefined8 *local_200;
  Vector *local_1f8;
  undefined8 *local_1f0;
  Vector *local_1e8;
  XML **local_1e0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_1d8;
  ulong local_180;
  ulong local_178;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_140;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_138;
  ulong local_130;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_120;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_118;
  Vector *local_110;
  Vector *local_108;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_100;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_f8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_f0;
  Vector *local_e8;
  Vector *local_e0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_d8;
  Vector *local_d0;
  Vector *local_c8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_c0;
  Vector *local_b8;
  Vector *local_b0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_a8;
  Vector *local_a0;
  Vector *local_98;
  Vector *local_90;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_88;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_80;
  Vector *local_78;
  Vector *local_70;
  Vector *local_68;
  Vector *local_60;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_58;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_50;
  size_t local_48;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_40;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  ulong local_8;
  
  if (*in_RDX == 0) {
    in_RDI->size_active = 0;
    in_RDI->size_alloced = 0;
    in_RDI->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
  }
  else {
    local_3a8 = in_RDX;
    bVar4 = std::operator==(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    if (!bVar4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_390 = local_3a8;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_3a8;
      ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffba8);
      std::operator+(__lhs,(char *)this_00);
      std::runtime_error::runtime_error(this_00,local_438);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_3a9 = 0;
    in_RDI->size_active = 0;
    in_RDI->size_alloced = 0;
    in_RDI->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
    local_3b8 = 0;
    while( true ) {
      uVar1 = local_3b8;
      local_380 = local_3a8;
      sVar5 = XML::size((XML *)0x37b7fd);
      if (sVar5 <= uVar1) break;
      local_388 = local_3a8;
      XML::child(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
      loadQuaternion(in_stack_00000290,in_stack_00000288);
      local_310 = &stack0xfffffffffffffbe8;
      local_2b8 = &local_358;
      local_270 = &local_348;
      local_278 = &local_338;
      local_260 = &local_328;
      uStack_350 = uStack_410;
      local_230 = &local_408;
      local_228 = &local_348;
      local_348 = local_408;
      uStack_340 = uStack_400;
      local_240 = &local_3f8;
      local_238 = &local_338;
      local_338 = local_3f8;
      uStack_330 = uStack_3f0;
      local_2b0 = &local_3e8;
      local_2a8 = &local_328;
      local_328 = local_3e8;
      uStack_320 = uStack_3e0;
      uVar1 = in_RDI->size_active;
      local_18 = in_RDI->size_active + 1;
      local_2c0 = local_310;
      local_2a0 = local_2b8;
      local_268 = local_2b8;
      local_250 = local_310;
      local_248 = local_2b8;
      local_220 = local_310;
      local_218 = local_2b8;
      local_358 = in_stack_fffffffffffffbe8;
      if (in_RDI->size_alloced < local_18) {
        uVar3 = local_18;
        if (in_RDI->size_alloced != 0) {
          local_20 = in_RDI->size_alloced;
          while (local_20 < local_18) {
            local_30[1] = 1;
            local_30[0] = local_20 << 1;
            puVar6 = std::max<unsigned_long>(local_30 + 1,local_30);
            local_20 = *puVar6;
          }
          local_8 = local_20;
          uVar3 = local_8;
        }
      }
      else {
        uVar3 = in_RDI->size_alloced;
      }
      local_8 = uVar3;
      local_158 = local_8;
      uVar3 = uVar1;
      if (uVar1 < in_RDI->size_active) {
        while (local_160 = uVar3, local_160 < in_RDI->size_active) {
          uVar3 = local_160 + 1;
        }
        in_RDI->size_active = uVar1;
      }
      local_150 = uVar1;
      if (local_8 == in_RDI->size_alloced) {
        for (local_168 = in_RDI->size_active; local_168 < uVar1; local_168 = local_168 + 1) {
          local_140 = in_RDI->items + local_168;
          local_e0 = &(local_140->l).vy;
          local_e8 = &(local_140->l).vz;
          local_90 = &local_140->p;
          local_f0 = local_140;
          local_d8 = local_140;
        }
        in_RDI->size_active = uVar1;
      }
      else {
        local_170 = in_RDI->items;
        local_130 = local_8;
        pAVar7 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                 alignedMalloc(in_stack_fffffffffffffb08,(size_t)in_stack_fffffffffffffb00);
        in_RDI->items = pAVar7;
        for (local_178 = 0; local_178 < in_RDI->size_active; local_178 = local_178 + 1) {
          local_118 = in_RDI->items + local_178;
          local_120 = local_170 + local_178;
          local_b0 = &(local_118->l).vy;
          local_b8 = &(local_118->l).vz;
          local_a0 = &local_118->p;
          uVar2 = *(undefined8 *)((long)&(local_120->l).vx.field_0 + 8);
          *(undefined8 *)&(local_118->l).vx.field_0 = *(undefined8 *)&(local_120->l).vx.field_0;
          *(undefined8 *)((long)&(local_118->l).vx.field_0 + 8) = uVar2;
          local_68 = &(local_120->l).vy;
          local_60 = &(local_118->l).vy;
          uVar2 = *(undefined8 *)((long)&(local_120->l).vy.field_0 + 8);
          *(undefined8 *)&local_60->field_0 = *(undefined8 *)&local_68->field_0;
          *(undefined8 *)((long)&(local_118->l).vy.field_0 + 8) = uVar2;
          local_78 = &(local_120->l).vz;
          local_70 = &(local_118->l).vz;
          uVar2 = *(undefined8 *)((long)&(local_120->l).vz.field_0 + 8);
          *(undefined8 *)&local_70->field_0 = *(undefined8 *)&local_78->field_0;
          *(undefined8 *)((long)&(local_118->l).vz.field_0 + 8) = uVar2;
          local_110 = &local_120->p;
          local_108 = &local_118->p;
          uVar2 = *(undefined8 *)((long)&(local_120->p).field_0 + 8);
          *(undefined8 *)&local_108->field_0 = *(undefined8 *)&local_110->field_0;
          *(undefined8 *)((long)&(local_118->p).field_0 + 8) = uVar2;
          local_100 = local_118;
          local_a8 = local_118;
          local_88 = local_120;
          local_80 = local_118;
          local_58 = local_120;
          local_50 = local_118;
        }
        for (local_180 = in_RDI->size_active; local_180 < local_150; local_180 = local_180 + 1) {
          local_138 = in_RDI->items + local_180;
          local_c8 = &(local_138->l).vy;
          local_d0 = &(local_138->l).vz;
          local_98 = &local_138->p;
          local_f8 = local_138;
          local_c0 = local_138;
        }
        local_48 = in_RDI->size_alloced;
        local_40 = local_170;
        alignedFree(in_stack_fffffffffffffaf8);
        in_RDI->size_active = local_150;
        in_RDI->size_alloced = local_158;
      }
      sVar5 = in_RDI->size_active;
      in_RDI->size_active = sVar5 + 1;
      local_2d8 = in_RDI->items + sVar5;
      local_2e0 = &local_358;
      local_288 = &(local_2d8->l).vy;
      local_290 = &(local_2d8->l).vz;
      local_258 = &local_2d8->p;
      *(XML **)&(local_2d8->l).vx.field_0 = local_358;
      *(undefined8 *)((long)&(local_2d8->l).vx.field_0 + 8) = uStack_350;
      local_1f0 = &local_348;
      local_1e8 = &(local_2d8->l).vy;
      *(undefined8 *)&local_1e8->field_0 = local_348;
      *(undefined8 *)((long)&(local_2d8->l).vy.field_0 + 8) = uStack_340;
      local_200 = &local_338;
      local_1f8 = &(local_2d8->l).vz;
      *(undefined8 *)&local_1f8->field_0 = local_338;
      *(undefined8 *)((long)&(local_2d8->l).vz.field_0 + 8) = uStack_330;
      local_2d0 = &local_328;
      local_2c8 = &local_2d8->p;
      (local_2c8->field_0).m128[0] = (float)local_328;
      (local_2d8->p).field_0.m128[1] = local_328._4_4_;
      (local_2d8->p).field_0.m128[2] = (float)uStack_320;
      (local_2d8->p).field_0.m128[3] = uStack_320._4_4_;
      local_300 = local_3d0;
      local_298 = local_2d8;
      local_280 = local_2d8;
      local_210 = local_2e0;
      local_208 = local_2d8;
      local_1e0 = local_2e0;
      local_1d8 = local_2d8;
      if (local_3d0[0] != (long *)0x0) {
        (**(code **)(*local_3d0[0] + 0x18))();
      }
      local_3b8 = local_3b8 + 1;
    }
  }
  return in_RDI;
}

Assistant:

avector<AffineSpace3ff> XMLLoader::loadQuaternionArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<AffineSpace3ff>();

    if (xml->name == "QuaternionArray") {
      avector<AffineSpace3ff> spaceArray;
      for (size_t i = 0; i < xml->size(); ++i) {
        auto child = xml->child(i);
        spaceArray.push_back(loadQuaternion(child));
      }
      return spaceArray;
    }
    else
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid Quaternion array");
  }